

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

void h2o_start_response(h2o_req_t *req,h2o_generator_t *generator)

{
  h2o_generator_t *generator_local;
  h2o_req_t *req_local;
  
  retain_original_response(req);
  if (req->_generator == (h2o_generator_t *)0x0) {
    req->_generator = generator;
    if (req->prefilters == (h2o_req_prefilter_t *)0x0) {
      h2o_setup_next_ostream(req,&req->_ostr_top);
    }
    else {
      (*req->prefilters->on_setup_ostream)(req->prefilters,req,&req->_ostr_top);
    }
    return;
  }
  __assert_fail("req->_generator == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/core/request.c"
                ,0x19a,"void h2o_start_response(h2o_req_t *, h2o_generator_t *)");
}

Assistant:

void h2o_start_response(h2o_req_t *req, h2o_generator_t *generator)
{
    retain_original_response(req);

    /* set generator */
    assert(req->_generator == NULL);
    req->_generator = generator;

    /* setup response filters */
    if (req->prefilters != NULL) {
        req->prefilters->on_setup_ostream(req->prefilters, req, &req->_ostr_top);
    } else {
        h2o_setup_next_ostream(req, &req->_ostr_top);
    }
}